

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::BVHNIntersector1<4,_16781328,_false,_embree::sse42::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  char cVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar34;
  float fVar36;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar33 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar45;
  float fVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar53;
  vfloat4 a0;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar54;
  float fVar55;
  float fVar59;
  float fVar60;
  vint4 ai_1;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  vint4 bi;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  vint4 ai;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar80;
  float fVar81;
  undefined1 auVar79 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  undefined1 auVar94 [16];
  float fVar97;
  Precalculations pre;
  NodeRef stack [244];
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8 != 8) && (fVar5 = ray->tfar, 0.0 <= fVar5)) {
    aVar6 = (ray->dir).field_0.field_1;
    fVar83 = aVar6.x;
    fVar85 = aVar6.y;
    fVar87 = aVar6.z;
    auVar25 = dpps((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
    auVar48 = rsqrtss(auVar25,auVar25);
    fVar23 = auVar48._0_4_;
    local_818[0] = fVar23 * 1.5 - fVar23 * fVar23 * auVar25._0_4_ * 0.5 * fVar23;
    auVar49._0_4_ = fVar83 * local_818[0];
    auVar49._4_4_ = fVar85 * local_818[0];
    auVar49._8_4_ = fVar87 * local_818[0];
    auVar49._12_4_ = aVar6.field_3.w * local_818[0];
    uVar18 = CONCAT44(auVar49._4_4_,auVar49._4_4_);
    auVar26._0_8_ = uVar18 ^ 0x8000000080000000;
    auVar26._8_4_ = -auVar49._12_4_;
    auVar26._12_4_ = -auVar49._12_4_;
    auVar62._0_12_ = ZEXT812(0);
    auVar62._12_4_ = 0;
    auVar26 = blendps(auVar26,auVar62,0xe);
    auVar25._4_4_ = auVar26._0_4_;
    auVar25._0_4_ = auVar49._8_4_;
    auVar25._8_4_ = auVar26._4_4_;
    auVar25._12_4_ = 0;
    auVar48._4_4_ = auVar26._0_4_;
    auVar48._0_4_ = auVar49._8_4_;
    auVar48._8_4_ = auVar26._4_4_;
    auVar48._12_4_ = 0;
    auVar79 = dpps(auVar48 << 0x20,auVar25 << 0x20,0x7f);
    uVar18 = CONCAT44(auVar49._12_4_,auVar49._8_4_);
    auVar69._0_8_ = uVar18 ^ 0x8000000080000000;
    auVar69._8_4_ = -auVar49._8_4_;
    auVar69._12_4_ = -auVar49._12_4_;
    auVar26 = insertps(auVar69,auVar49,0x2a);
    auVar48 = dpps(auVar26,auVar26,0x7f);
    iVar22 = -(uint)(auVar48._0_4_ < auVar79._0_4_);
    auVar79._4_4_ = iVar22;
    auVar79._0_4_ = iVar22;
    auVar79._8_4_ = iVar22;
    auVar79._12_4_ = iVar22;
    auVar25 = blendvps(auVar26,auVar25 << 0x20,auVar79);
    auVar48 = dpps(auVar25,auVar25,0x7f);
    auVar26 = rsqrtss(auVar48,auVar48);
    fVar23 = auVar26._0_4_;
    fVar23 = fVar23 * 1.5 - fVar23 * fVar23 * auVar48._0_4_ * 0.5 * fVar23;
    fVar24 = fVar23 * auVar25._0_4_;
    fVar34 = fVar23 * auVar25._4_4_;
    fVar36 = fVar23 * auVar25._8_4_;
    fVar23 = fVar23 * auVar25._12_4_;
    fVar65 = fVar34 * auVar49._0_4_ - auVar49._4_4_ * fVar24;
    fVar72 = fVar36 * auVar49._4_4_ - auVar49._8_4_ * fVar34;
    fVar74 = fVar24 * auVar49._8_4_ - auVar49._0_4_ * fVar36;
    auVar70._12_4_ = fVar23 * auVar49._12_4_ - auVar49._12_4_ * fVar23;
    auVar70._0_8_ = CONCAT44(fVar74,fVar72);
    auVar70._8_4_ = fVar65;
    auVar76._8_4_ = fVar65;
    auVar76._0_8_ = auVar70._0_8_;
    auVar76._12_4_ = auVar70._12_4_;
    auVar25 = dpps(auVar76,auVar70,0x7f);
    auVar48 = rsqrtss(auVar25,auVar25);
    fVar23 = auVar48._0_4_;
    fVar23 = fVar23 * 1.5 - fVar23 * fVar23 * auVar25._0_4_ * 0.5 * fVar23;
    local_7e8._4_4_ = fVar23 * fVar65;
    local_7e8._0_4_ = fVar36;
    local_7e8._8_4_ = auVar49._8_4_ * local_818[0];
    local_7e8._12_4_ = 0;
    local_808._4_4_ = fVar23 * fVar72;
    local_808._0_4_ = fVar24;
    local_808._8_4_ = auVar49._0_4_ * local_818[0];
    local_808._12_4_ = 0;
    local_7f8._4_4_ = fVar23 * fVar74;
    local_7f8._0_4_ = fVar34;
    local_7f8._8_4_ = auVar49._4_4_ * local_818[0];
    local_7f8._12_4_ = 0;
    puVar19 = local_7d0;
    fVar24 = (ray->org).field_0.m128[0];
    fVar34 = (ray->org).field_0.m128[1];
    fVar36 = (ray->org).field_0.m128[2];
    fVar65 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar23 = 0.0;
    if (0.0 <= fVar65) {
      fVar23 = fVar65;
    }
    auVar27._4_4_ = -(uint)(ABS(fVar85) < DAT_01f80d30._4_4_);
    auVar27._0_4_ = -(uint)(ABS(fVar83) < (float)DAT_01f80d30);
    auVar27._8_4_ = -(uint)(ABS(fVar87) < DAT_01f80d30._8_4_);
    auVar27._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01f80d30._12_4_);
    auVar48 = blendvps((undefined1  [16])aVar6,_DAT_01f80d30,auVar27);
    auVar25 = rcpps(auVar27,auVar48);
    fVar65 = auVar25._0_4_;
    fVar72 = auVar25._4_4_;
    fVar74 = auVar25._8_4_;
    fVar65 = (1.0 - auVar48._0_4_ * fVar65) * fVar65 + fVar65;
    fVar72 = (1.0 - auVar48._4_4_ * fVar72) * fVar72 + fVar72;
    fVar74 = (1.0 - auVar48._8_4_ * fVar74) * fVar74 + fVar74;
    uVar21 = (ulong)(fVar65 < 0.0) * 0x10;
    uVar20 = (ulong)(fVar72 < 0.0) << 4 | 0x20;
    uVar18 = (ulong)(fVar74 < 0.0) << 4 | 0x40;
    auVar71._4_4_ = fVar23;
    auVar71._0_4_ = fVar23;
    auVar71._8_4_ = fVar23;
    auVar71._12_4_ = fVar23;
LAB_00217e25:
    do {
      if (puVar19 == &local_7d8) {
        return;
      }
      uVar15 = puVar19[-1];
      puVar19 = puVar19 + -1;
      while ((uVar15 & 8) == 0) {
        fVar23 = (ray->dir).field_0.m128[3];
        uVar16 = (uint)uVar15 & 7;
        uVar14 = uVar15 & 0xfffffffffffffff0;
        if (uVar16 == 3) {
          fVar66 = 1.0 - fVar23;
          fVar67 = fVar66 * 0.0;
          auVar94._0_4_ =
               fVar83 * *(float *)(uVar14 + 0x20) +
               fVar85 * *(float *)(uVar14 + 0x50) + fVar87 * *(float *)(uVar14 + 0x80);
          auVar94._4_4_ =
               fVar83 * *(float *)(uVar14 + 0x24) +
               fVar85 * *(float *)(uVar14 + 0x54) + fVar87 * *(float *)(uVar14 + 0x84);
          auVar94._8_4_ =
               fVar83 * *(float *)(uVar14 + 0x28) +
               fVar85 * *(float *)(uVar14 + 0x58) + fVar87 * *(float *)(uVar14 + 0x88);
          auVar94._12_4_ =
               fVar83 * *(float *)(uVar14 + 0x2c) +
               fVar85 * *(float *)(uVar14 + 0x5c) + fVar87 * *(float *)(uVar14 + 0x8c);
          fVar78 = (float)DAT_01f80d30;
          fVar80 = DAT_01f80d30._4_4_;
          fVar81 = DAT_01f80d30._8_4_;
          fVar82 = DAT_01f80d30._12_4_;
          auVar30._4_4_ = -(uint)(ABS(auVar94._4_4_) < fVar80);
          auVar30._0_4_ = -(uint)(ABS(auVar94._0_4_) < fVar78);
          auVar30._8_4_ = -(uint)(ABS(auVar94._8_4_) < fVar81);
          auVar30._12_4_ = -(uint)(ABS(auVar94._12_4_) < fVar82);
          auVar79 = blendvps(auVar94,_DAT_01f80d30,auVar30);
          auVar57._0_4_ =
               fVar83 * *(float *)(uVar14 + 0x30) +
               fVar85 * *(float *)(uVar14 + 0x60) + fVar87 * *(float *)(uVar14 + 0x90);
          auVar57._4_4_ =
               fVar83 * *(float *)(uVar14 + 0x34) +
               fVar85 * *(float *)(uVar14 + 100) + fVar87 * *(float *)(uVar14 + 0x94);
          auVar57._8_4_ =
               fVar83 * *(float *)(uVar14 + 0x38) +
               fVar85 * *(float *)(uVar14 + 0x68) + fVar87 * *(float *)(uVar14 + 0x98);
          auVar57._12_4_ =
               fVar83 * *(float *)(uVar14 + 0x3c) +
               fVar85 * *(float *)(uVar14 + 0x6c) + fVar87 * *(float *)(uVar14 + 0x9c);
          auVar31._4_4_ = -(uint)(ABS(auVar57._4_4_) < fVar80);
          auVar31._0_4_ = -(uint)(ABS(auVar57._0_4_) < fVar78);
          auVar31._8_4_ = -(uint)(ABS(auVar57._8_4_) < fVar81);
          auVar31._12_4_ = -(uint)(ABS(auVar57._12_4_) < fVar82);
          auVar26 = blendvps(auVar57,_DAT_01f80d30,auVar31);
          local_878 = (float)*(undefined8 *)(uVar14 + 0xa0);
          fStack_874 = (float)((ulong)*(undefined8 *)(uVar14 + 0xa0) >> 0x20);
          fStack_870 = (float)*(undefined8 *)(uVar14 + 0xa8);
          fStack_86c = (float)((ulong)*(undefined8 *)(uVar14 + 0xa8) >> 0x20);
          auVar42._0_4_ =
               fVar83 * *(float *)(uVar14 + 0x40) +
               fVar85 * *(float *)(uVar14 + 0x70) + fVar87 * local_878;
          auVar42._4_4_ =
               fVar83 * *(float *)(uVar14 + 0x44) +
               fVar85 * *(float *)(uVar14 + 0x74) + fVar87 * fStack_874;
          auVar42._8_4_ =
               fVar83 * *(float *)(uVar14 + 0x48) +
               fVar85 * *(float *)(uVar14 + 0x78) + fVar87 * fStack_870;
          auVar42._12_4_ =
               fVar83 * *(float *)(uVar14 + 0x4c) +
               fVar85 * *(float *)(uVar14 + 0x7c) + fVar87 * fStack_86c;
          auVar32._4_4_ = -(uint)(ABS(auVar42._4_4_) < fVar80);
          auVar32._0_4_ = -(uint)(ABS(auVar42._0_4_) < fVar78);
          auVar32._8_4_ = -(uint)(ABS(auVar42._8_4_) < fVar81);
          auVar32._12_4_ = -(uint)(ABS(auVar42._12_4_) < fVar82);
          auVar48 = blendvps(auVar42,_DAT_01f80d30,auVar32);
          auVar25 = rcpps(auVar32,auVar79);
          fVar78 = auVar25._0_4_;
          fVar82 = auVar25._4_4_;
          fVar53 = auVar25._8_4_;
          fVar54 = auVar25._12_4_;
          fVar78 = (1.0 - auVar79._0_4_ * fVar78) * fVar78 + fVar78;
          fVar82 = (1.0 - auVar79._4_4_ * fVar82) * fVar82 + fVar82;
          fVar53 = (1.0 - auVar79._8_4_ * fVar53) * fVar53 + fVar53;
          fVar54 = (1.0 - auVar79._12_4_ * fVar54) * fVar54 + fVar54;
          auVar25 = rcpps(auVar25,auVar26);
          fVar80 = auVar25._0_4_;
          auVar58._0_4_ = auVar26._0_4_ * fVar80;
          fVar95 = auVar25._4_4_;
          auVar58._4_4_ = auVar26._4_4_ * fVar95;
          fVar96 = auVar25._8_4_;
          auVar58._8_4_ = auVar26._8_4_ * fVar96;
          fVar97 = auVar25._12_4_;
          auVar58._12_4_ = auVar26._12_4_ * fVar97;
          fVar80 = (1.0 - auVar58._0_4_) * fVar80 + fVar80;
          fVar95 = (1.0 - auVar58._4_4_) * fVar95 + fVar95;
          fVar96 = (1.0 - auVar58._8_4_) * fVar96 + fVar96;
          fVar97 = (1.0 - auVar58._12_4_) * fVar97 + fVar97;
          auVar25 = rcpps(auVar58,auVar48);
          fVar81 = auVar25._0_4_;
          fVar35 = auVar25._4_4_;
          fVar37 = auVar25._8_4_;
          fVar38 = auVar25._12_4_;
          fVar81 = (1.0 - auVar48._0_4_ * fVar81) * fVar81 + fVar81;
          fVar35 = (1.0 - auVar48._4_4_ * fVar35) * fVar35 + fVar35;
          fVar37 = (1.0 - auVar48._8_4_ * fVar37) * fVar37 + fVar37;
          fVar38 = (1.0 - auVar48._12_4_ * fVar38) * fVar38 + fVar38;
          fVar84 = *(float *)(uVar14 + 0x20) * fVar24 +
                   *(float *)(uVar14 + 0x50) * fVar34 +
                   *(float *)(uVar14 + 0x80) * fVar36 + *(float *)(uVar14 + 0xb0);
          fVar86 = *(float *)(uVar14 + 0x24) * fVar24 +
                   *(float *)(uVar14 + 0x54) * fVar34 +
                   *(float *)(uVar14 + 0x84) * fVar36 + *(float *)(uVar14 + 0xb4);
          fVar88 = *(float *)(uVar14 + 0x28) * fVar24 +
                   *(float *)(uVar14 + 0x58) * fVar34 +
                   *(float *)(uVar14 + 0x88) * fVar36 + *(float *)(uVar14 + 0xb8);
          fVar89 = *(float *)(uVar14 + 0x2c) * fVar24 +
                   *(float *)(uVar14 + 0x5c) * fVar34 +
                   *(float *)(uVar14 + 0x8c) * fVar36 + *(float *)(uVar14 + 0xbc);
          fVar40 = *(float *)(uVar14 + 0x30) * fVar24 +
                   *(float *)(uVar14 + 0x60) * fVar34 +
                   *(float *)(uVar14 + 0x90) * fVar36 + *(float *)(uVar14 + 0xc0);
          fVar45 = *(float *)(uVar14 + 0x34) * fVar24 +
                   *(float *)(uVar14 + 100) * fVar34 +
                   *(float *)(uVar14 + 0x94) * fVar36 + *(float *)(uVar14 + 0xc4);
          fVar46 = *(float *)(uVar14 + 0x38) * fVar24 +
                   *(float *)(uVar14 + 0x68) * fVar34 +
                   *(float *)(uVar14 + 0x98) * fVar36 + *(float *)(uVar14 + 200);
          fVar47 = *(float *)(uVar14 + 0x3c) * fVar24 +
                   *(float *)(uVar14 + 0x6c) * fVar34 +
                   *(float *)(uVar14 + 0x9c) * fVar36 + *(float *)(uVar14 + 0xcc);
          fVar90 = *(float *)(uVar14 + 0x40) * fVar24 +
                   *(float *)(uVar14 + 0x70) * fVar34 +
                   local_878 * fVar36 + *(float *)(uVar14 + 0xd0);
          fVar91 = *(float *)(uVar14 + 0x44) * fVar24 +
                   *(float *)(uVar14 + 0x74) * fVar34 +
                   fStack_874 * fVar36 + *(float *)(uVar14 + 0xd4);
          fVar92 = *(float *)(uVar14 + 0x48) * fVar24 +
                   *(float *)(uVar14 + 0x78) * fVar34 +
                   fStack_870 * fVar36 + *(float *)(uVar14 + 0xd8);
          fVar93 = *(float *)(uVar14 + 0x4c) * fVar24 +
                   *(float *)(uVar14 + 0x7c) * fVar34 +
                   fStack_86c * fVar36 + *(float *)(uVar14 + 0xdc);
          fVar55 = ((*(float *)(uVar14 + 0xe0) * fVar23 + fVar67) - fVar84) * fVar78;
          fVar59 = ((*(float *)(uVar14 + 0xe4) * fVar23 + fVar67) - fVar86) * fVar82;
          fVar60 = ((*(float *)(uVar14 + 0xe8) * fVar23 + fVar67) - fVar88) * fVar53;
          fVar61 = ((*(float *)(uVar14 + 0xec) * fVar23 + fVar67) - fVar89) * fVar54;
          fVar78 = ((*(float *)(uVar14 + 0x110) * fVar23 + fVar66) - fVar84) * fVar78;
          fVar82 = ((*(float *)(uVar14 + 0x114) * fVar23 + fVar66) - fVar86) * fVar82;
          fVar53 = ((*(float *)(uVar14 + 0x118) * fVar23 + fVar66) - fVar88) * fVar53;
          fVar54 = ((*(float *)(uVar14 + 0x11c) * fVar23 + fVar66) - fVar89) * fVar54;
          fVar84 = ((*(float *)(uVar14 + 0xf0) * fVar23 + fVar67) - fVar40) * fVar80;
          fVar86 = ((*(float *)(uVar14 + 0xf4) * fVar23 + fVar67) - fVar45) * fVar95;
          fVar88 = ((*(float *)(uVar14 + 0xf8) * fVar23 + fVar67) - fVar46) * fVar96;
          fVar89 = ((*(float *)(uVar14 + 0xfc) * fVar23 + fVar67) - fVar47) * fVar97;
          fVar68 = ((fVar67 + *(float *)(uVar14 + 0x100) * fVar23) - fVar90) * fVar81;
          fVar73 = ((fVar67 + *(float *)(uVar14 + 0x104) * fVar23) - fVar91) * fVar35;
          fVar75 = ((fVar67 + *(float *)(uVar14 + 0x108) * fVar23) - fVar92) * fVar37;
          fVar67 = ((fVar67 + *(float *)(uVar14 + 0x10c) * fVar23) - fVar93) * fVar38;
          fVar80 = ((*(float *)(uVar14 + 0x120) * fVar23 + fVar66) - fVar40) * fVar80;
          fVar95 = ((*(float *)(uVar14 + 0x124) * fVar23 + fVar66) - fVar45) * fVar95;
          fVar96 = ((*(float *)(uVar14 + 0x128) * fVar23 + fVar66) - fVar46) * fVar96;
          fVar97 = ((*(float *)(uVar14 + 300) * fVar23 + fVar66) - fVar47) * fVar97;
          fVar81 = ((fVar23 * *(float *)(uVar14 + 0x130) + fVar66) - fVar90) * fVar81;
          fVar35 = ((fVar23 * *(float *)(uVar14 + 0x134) + fVar66) - fVar91) * fVar35;
          fVar37 = ((fVar23 * *(float *)(uVar14 + 0x138) + fVar66) - fVar92) * fVar37;
          fVar38 = ((fVar23 * *(float *)(uVar14 + 0x13c) + fVar66) - fVar93) * fVar38;
          auVar33._0_4_ =
               (uint)((int)fVar80 < (int)fVar84) * (int)fVar80 |
               (uint)((int)fVar80 >= (int)fVar84) * (int)fVar84;
          auVar33._4_4_ =
               (uint)((int)fVar95 < (int)fVar86) * (int)fVar95 |
               (uint)((int)fVar95 >= (int)fVar86) * (int)fVar86;
          auVar33._8_4_ =
               (uint)((int)fVar96 < (int)fVar88) * (int)fVar96 |
               (uint)((int)fVar96 >= (int)fVar88) * (int)fVar88;
          auVar33._12_4_ =
               (uint)((int)fVar97 < (int)fVar89) * (int)fVar97 |
               (uint)((int)fVar97 >= (int)fVar89) * (int)fVar89;
          auVar43._0_4_ =
               (uint)((int)fVar81 < (int)fVar68) * (int)fVar81 |
               (uint)((int)fVar81 >= (int)fVar68) * (int)fVar68;
          auVar43._4_4_ =
               (uint)((int)fVar35 < (int)fVar73) * (int)fVar35 |
               (uint)((int)fVar35 >= (int)fVar73) * (int)fVar73;
          auVar43._8_4_ =
               (uint)((int)fVar37 < (int)fVar75) * (int)fVar37 |
               (uint)((int)fVar37 >= (int)fVar75) * (int)fVar75;
          auVar43._12_4_ =
               (uint)((int)fVar38 < (int)fVar67) * (int)fVar38 |
               (uint)((int)fVar38 >= (int)fVar67) * (int)fVar67;
          auVar25 = maxps(auVar33,auVar43);
          auVar44._0_4_ =
               (uint)((int)fVar78 < (int)fVar55) * (int)fVar78 |
               (uint)((int)fVar78 >= (int)fVar55) * (int)fVar55;
          auVar44._4_4_ =
               (uint)((int)fVar82 < (int)fVar59) * (int)fVar82 |
               (uint)((int)fVar82 >= (int)fVar59) * (int)fVar59;
          auVar44._8_4_ =
               (uint)((int)fVar53 < (int)fVar60) * (int)fVar53 |
               (uint)((int)fVar53 >= (int)fVar60) * (int)fVar60;
          auVar44._12_4_ =
               (uint)((int)fVar54 < (int)fVar61) * (int)fVar54 |
               (uint)((int)fVar54 >= (int)fVar61) * (int)fVar61;
          auVar64._0_4_ =
               (uint)((int)fVar78 < (int)fVar55) * (int)fVar55 |
               (uint)((int)fVar78 >= (int)fVar55) * (int)fVar78;
          auVar64._4_4_ =
               (uint)((int)fVar82 < (int)fVar59) * (int)fVar59 |
               (uint)((int)fVar82 >= (int)fVar59) * (int)fVar82;
          auVar64._8_4_ =
               (uint)((int)fVar53 < (int)fVar60) * (int)fVar60 |
               (uint)((int)fVar53 >= (int)fVar60) * (int)fVar53;
          auVar64._12_4_ =
               (uint)((int)fVar54 < (int)fVar61) * (int)fVar61 |
               (uint)((int)fVar54 >= (int)fVar61) * (int)fVar54;
          auVar12._4_4_ = fVar5;
          auVar12._0_4_ = fVar5;
          auVar12._8_4_ = fVar5;
          auVar12._12_4_ = fVar5;
          auVar77._0_4_ =
               (uint)((int)fVar80 < (int)fVar84) * (int)fVar84 |
               (uint)((int)fVar80 >= (int)fVar84) * (int)fVar80;
          auVar77._4_4_ =
               (uint)((int)fVar95 < (int)fVar86) * (int)fVar86 |
               (uint)((int)fVar95 >= (int)fVar86) * (int)fVar95;
          auVar77._8_4_ =
               (uint)((int)fVar96 < (int)fVar88) * (int)fVar88 |
               (uint)((int)fVar96 >= (int)fVar88) * (int)fVar96;
          auVar77._12_4_ =
               (uint)((int)fVar97 < (int)fVar89) * (int)fVar89 |
               (uint)((int)fVar97 >= (int)fVar89) * (int)fVar97;
          auVar39._0_4_ =
               (uint)((int)fVar81 < (int)fVar68) * (int)fVar68 |
               (uint)((int)fVar81 >= (int)fVar68) * (int)fVar81;
          auVar39._4_4_ =
               (uint)((int)fVar35 < (int)fVar73) * (int)fVar73 |
               (uint)((int)fVar35 >= (int)fVar73) * (int)fVar35;
          auVar39._8_4_ =
               (uint)((int)fVar37 < (int)fVar75) * (int)fVar75 |
               (uint)((int)fVar37 >= (int)fVar75) * (int)fVar37;
          auVar39._12_4_ =
               (uint)((int)fVar38 < (int)fVar67) * (int)fVar67 |
               (uint)((int)fVar38 >= (int)fVar67) * (int)fVar38;
          auVar26 = minps(auVar77,auVar39);
          auVar48 = maxps(auVar71,auVar44);
          auVar48 = maxps(auVar48,auVar25);
          auVar25 = minps(auVar12,auVar64);
          auVar25 = minps(auVar25,auVar26);
LAB_00217f16:
          bVar8 = auVar48._0_4_ <= auVar25._0_4_;
          bVar9 = auVar48._4_4_ <= auVar25._4_4_;
          bVar10 = auVar48._8_4_ <= auVar25._8_4_;
          bVar11 = auVar48._12_4_ <= auVar25._12_4_;
        }
        else {
          pfVar3 = (float *)(uVar14 + 0x80 + uVar21);
          pfVar1 = (float *)(uVar14 + 0x20 + uVar21);
          pfVar4 = (float *)(uVar14 + 0x80 + uVar20);
          pfVar2 = (float *)(uVar14 + 0x20 + uVar20);
          auVar28._0_4_ = ((*pfVar3 * fVar23 + *pfVar1) - fVar24) * fVar65;
          auVar28._4_4_ = ((pfVar3[1] * fVar23 + pfVar1[1]) - fVar24) * fVar65;
          auVar28._8_4_ = ((pfVar3[2] * fVar23 + pfVar1[2]) - fVar24) * fVar65;
          auVar28._12_4_ = ((pfVar3[3] * fVar23 + pfVar1[3]) - fVar24) * fVar65;
          auVar41._0_4_ = ((*pfVar4 * fVar23 + *pfVar2) - fVar34) * fVar72;
          auVar41._4_4_ = ((pfVar4[1] * fVar23 + pfVar2[1]) - fVar34) * fVar72;
          auVar41._8_4_ = ((pfVar4[2] * fVar23 + pfVar2[2]) - fVar34) * fVar72;
          auVar41._12_4_ = ((pfVar4[3] * fVar23 + pfVar2[3]) - fVar34) * fVar72;
          pfVar2 = (float *)(uVar14 + 0x80 + uVar18);
          pfVar1 = (float *)(uVar14 + 0x20 + uVar18);
          auVar50._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar36) * fVar74;
          auVar50._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar36) * fVar74;
          auVar50._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar36) * fVar74;
          auVar50._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar36) * fVar74;
          auVar25 = maxps(auVar41,auVar50);
          pfVar2 = (float *)(uVar14 + 0x80 + (uVar21 ^ 0x10));
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar21 ^ 0x10));
          auVar56._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar24) * fVar65;
          auVar56._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar24) * fVar65;
          auVar56._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar24) * fVar65;
          auVar56._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar24) * fVar65;
          pfVar2 = (float *)(uVar14 + 0x80 + (uVar20 ^ 0x10));
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar20 ^ 0x10));
          auVar63._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar34) * fVar72;
          auVar63._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar34) * fVar72;
          auVar63._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar34) * fVar72;
          auVar63._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar34) * fVar72;
          pfVar2 = (float *)(uVar14 + 0x80 + (uVar18 ^ 0x10));
          pfVar1 = (float *)(uVar14 + 0x20 + (uVar18 ^ 0x10));
          auVar51._0_4_ = ((*pfVar2 * fVar23 + *pfVar1) - fVar36) * fVar74;
          auVar51._4_4_ = ((pfVar2[1] * fVar23 + pfVar1[1]) - fVar36) * fVar74;
          auVar51._8_4_ = ((pfVar2[2] * fVar23 + pfVar1[2]) - fVar36) * fVar74;
          auVar51._12_4_ = ((pfVar2[3] * fVar23 + pfVar1[3]) - fVar36) * fVar74;
          auVar26 = minps(auVar63,auVar51);
          auVar48 = maxps(auVar71,auVar28);
          auVar48 = maxps(auVar48,auVar25);
          auVar29._4_4_ = fVar5;
          auVar29._0_4_ = fVar5;
          auVar29._8_4_ = fVar5;
          auVar29._12_4_ = fVar5;
          auVar25 = minps(auVar29,auVar56);
          auVar25 = minps(auVar25,auVar26);
          if (uVar16 != 6) goto LAB_00217f16;
          bVar8 = (fVar23 < *(float *)(uVar14 + 0xf0) && *(float *)(uVar14 + 0xe0) <= fVar23) &&
                  auVar48._0_4_ <= auVar25._0_4_;
          bVar9 = (fVar23 < *(float *)(uVar14 + 0xf4) && *(float *)(uVar14 + 0xe4) <= fVar23) &&
                  auVar48._4_4_ <= auVar25._4_4_;
          bVar10 = (fVar23 < *(float *)(uVar14 + 0xf8) && *(float *)(uVar14 + 0xe8) <= fVar23) &&
                   auVar48._8_4_ <= auVar25._8_4_;
          bVar11 = (fVar23 < *(float *)(uVar14 + 0xfc) && *(float *)(uVar14 + 0xec) <= fVar23) &&
                   auVar48._12_4_ <= auVar25._12_4_;
        }
        auVar52._0_4_ = (uint)bVar8 * -0x80000000;
        auVar52._4_4_ = (uint)bVar9 * -0x80000000;
        auVar52._8_4_ = (uint)bVar10 * -0x80000000;
        auVar52._12_4_ = (uint)bVar11 * -0x80000000;
        uVar16 = movmskps((uint)uVar15,auVar52);
        if (uVar16 == 0) goto LAB_00217e25;
        uVar16 = uVar16 & 0xff;
        lVar7 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
        uVar16 = uVar16 - 1 & uVar16;
        if (uVar16 != 0) {
          *puVar19 = uVar15;
          puVar19 = puVar19 + 1;
          lVar7 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
          uVar16 = uVar16 - 1 & uVar16;
          uVar17 = (ulong)uVar16;
          if (uVar16 != 0) {
            do {
              *puVar19 = uVar15;
              puVar19 = puVar19 + 1;
              lVar7 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              uVar15 = *(ulong *)(uVar14 + lVar7 * 8);
              uVar17 = uVar17 & uVar17 - 1;
            } while (uVar17 != 0);
          }
        }
      }
      cVar13 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 8))
                         (local_818,ray,context);
    } while (cVar13 == '\0');
    ray->tfar = -INFINITY;
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }